

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

duckdb_string
duckdb::
TryCastCInternal<char*,duckdb_string,duckdb::FromCStringCastWrapper<duckdb::ToCStringCastWrapper<duckdb::StringCast>>>
          (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  duckdb_string result_value;
  duckdb_string local_20;
  
  bVar1 = FromCStringCastWrapper<duckdb::ToCStringCastWrapper<duckdb::StringCast>>::
          Operation<char*,duckdb_string>
                    (*(char **)((long)result->deprecated_columns[col].deprecated_data + row * 8),
                     &local_20);
  if (!bVar1) {
    local_20 = FetchDefaultValue::Operation<duckdb_string>();
  }
  return local_20;
}

Assistant:

void *UnsafeFetchPtr(duckdb_result *result, idx_t col, idx_t row) {
	D_ASSERT(row < result->deprecated_row_count);
	return (void *)&(((T *)result->deprecated_columns[col].deprecated_data)[row]);
}